

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_head.h
# Opt level: O3

void anon_unknown.dwarf_81474::buildAndAssert_Elements_Multiple(int elements)

{
  _List_node_base *p_Var1;
  ulong uVar2;
  _List_node_base *p_Var3;
  bool bVar4;
  cell cVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char *in_R9;
  _Base_ptr p_Var10;
  uint column;
  uint uVar11;
  internal iVar12;
  AssertionResult gtest_ar_;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> elements_1;
  SudokuGitter gitter;
  SudokuGenerator generator;
  undefined8 local_190;
  internal local_188 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_180;
  AssertHelper local_178;
  undefined1 local_170 [32];
  _Base_ptr local_150;
  ulong local_148;
  int local_13c;
  ulong local_138;
  ulong local_130;
  int local_128;
  uint local_124;
  int local_120;
  uint local_11c;
  SudokuGitter local_118;
  SudokuGitter local_f0;
  SudokuGitter local_c8;
  SudokuGitter local_a0;
  SudokuGenerator local_78;
  
  local_130 = (ulong)(uint)elements;
  local_138 = (ulong)SQRT((double)local_130);
  local_128 = 0;
  do {
    p_Var10 = (_Base_ptr)(local_170 + 8);
    SudokuGenerator::SudokuGenerator(&local_78,elements);
    SudokuGenerator::generateNew(&local_118,&local_78);
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::vector(&local_a0.cells,&local_118.cells);
    local_a0.quadHeight = local_118.quadHeight;
    local_a0.elements = local_118.elements;
    local_a0.quadWidth = local_118.quadWidth;
    iVar12 = (internal)0x1;
    if (elements != 0) {
      iVar12 = (internal)0x0;
      uVar6 = 0;
      do {
        local_170._8_4_ = _S_red;
        local_170._16_8_ = (_Base_ptr)0x0;
        local_148 = 0;
        uVar11 = 0;
        local_170._24_8_ = p_Var10;
        local_150 = p_Var10;
        do {
          cVar5 = SudokuGitter::getCell(&local_a0,uVar6,uVar11);
          local_190._0_4_ = cVar5.value;
          local_190._4_4_ = CONCAT31(local_190._5_3_,cVar5.isStatic);
          if ((uint)local_190 != 0) {
            std::
            _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
            ::_M_insert_unique<unsigned_int_const&>
                      ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)local_170,(uint *)&local_190);
          }
          uVar11 = uVar11 + 1;
        } while (elements != uVar11);
        if (local_148 != local_130) {
          std::
          _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
          ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                       *)local_170);
          goto LAB_001183ca;
        }
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::clear((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_170);
        std::
        _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
        ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                     *)local_170);
        uVar6 = uVar6 + 1;
        iVar12 = (internal)((uint)elements <= uVar6);
      } while (uVar6 != elements);
      iVar12 = (internal)0x1;
    }
LAB_001183ca:
    local_188[0] = iVar12;
    local_180.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::~vector(&local_a0.cells);
    if (local_188[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_190);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_170,local_188,(AssertionResult *)"checkRows(gitter, size)","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_178,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ob-algdatii-ss18[P]leistungsnachweis-algo/test/test_head.h"
                 ,0x61,(char *)local_170._0_8_);
      testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_190);
      testing::internal::AssertHelper::~AssertHelper(&local_178);
      if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
        operator_delete((void *)local_170._0_8_);
      }
      if (((CONCAT44(local_190._4_4_,(uint)local_190) != 0) &&
          (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
         ((long *)CONCAT44(local_190._4_4_,(uint)local_190) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_190._4_4_,(uint)local_190) + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      std::
      vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
      ::vector(&local_c8.cells,&local_118.cells);
      local_c8.quadHeight = local_118.quadHeight;
      local_c8.elements = local_118.elements;
      local_c8.quadWidth = local_118.quadWidth;
      iVar12 = (internal)0x1;
      if (elements != 0) {
        iVar12 = (internal)0x0;
        uVar6 = 0;
        do {
          local_170._8_4_ = _S_red;
          local_170._16_8_ = (_Base_ptr)0x0;
          local_148 = 0;
          uVar11 = 0;
          local_170._24_8_ = p_Var10;
          local_150 = p_Var10;
          do {
            cVar5 = SudokuGitter::getCell(&local_c8,uVar11,uVar6);
            if (cVar5.value != 0) {
              local_190._0_4_ = cVar5.value;
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>
                        ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                          *)local_170,(int *)&local_190);
            }
            uVar11 = uVar11 + 1;
          } while (elements != uVar11);
          if (local_148 != local_130) {
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)local_170);
            goto LAB_00118599;
          }
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
                    ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      *)local_170);
          std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
          ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *
                    )local_170);
          uVar6 = uVar6 + 1;
          iVar12 = (internal)((uint)elements <= uVar6);
        } while (uVar6 != elements);
        iVar12 = (internal)0x1;
      }
LAB_00118599:
      local_188[0] = iVar12;
      local_180.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      std::
      vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
      ::~vector(&local_c8.cells);
      if (local_188[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_190);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_170,local_188,(AssertionResult *)"checkColumns(gitter, size)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_178,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ob-algdatii-ss18[P]leistungsnachweis-algo/test/test_head.h"
                   ,0x62,(char *)local_170._0_8_);
        testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_190);
        testing::internal::AssertHelper::~AssertHelper(&local_178);
        if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
          operator_delete((void *)local_170._0_8_);
        }
        if (((CONCAT44(local_190._4_4_,(uint)local_190) != 0) &&
            (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
           ((long *)CONCAT44(local_190._4_4_,(uint)local_190) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_190._4_4_,(uint)local_190) + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
        std::
        vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
        ::vector(&local_f0.cells,&local_118.cells);
        local_13c = (int)((ulong)(uint)elements / (local_138 & 0xffffffff));
        local_f0.quadHeight = local_118.quadHeight;
        local_f0.elements = local_118.elements;
        local_f0.quadWidth = local_118.quadWidth;
        iVar12 = (internal)0x1;
        if (elements != 0) {
          uVar8 = 0;
          uVar9 = 0;
          do {
            local_170._24_8_ = local_170 + 8;
            local_170._8_4_ = _S_red;
            local_170._16_8_ = (_Base_ptr)0x0;
            local_148 = 0;
            local_120 = (int)uVar9;
            uVar2 = (ulong)(uint)(local_120 * local_13c) % (ulong)(uint)elements;
            uVar6 = local_120 - (int)(uVar9 % (local_138 & 0xffffffff));
            local_150 = (_Base_ptr)local_170._24_8_;
            if (uVar6 < (int)local_138 + uVar6) {
              local_124 = (uint)uVar8;
              uVar11 = (int)uVar2 + local_13c;
              local_11c = ((int)(uVar9 / (local_138 & 0xffffffff)) + 1) * (int)local_138;
              do {
                uVar8 = uVar2;
                if ((uint)local_138 <= (uint)elements) {
                  do {
                    cVar5 = SudokuGitter::getCell(&local_f0,uVar6,(uint)uVar8);
                    if (cVar5.value != 0) {
                      local_190._0_4_ = cVar5.value;
                      std::
                      _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                      ::_M_insert_unique<int>
                                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                                  *)local_170,(int *)&local_190);
                    }
                    uVar7 = (uint)uVar8 + 1;
                    uVar8 = (ulong)uVar7;
                  } while (uVar7 < uVar11);
                }
                uVar6 = uVar6 + 1;
              } while (uVar6 != local_11c);
              uVar8 = (ulong)local_124;
            }
            if (local_148 != local_130) {
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                         *)local_170);
              iVar12 = (internal)((byte)uVar8 & 1);
              goto LAB_001187d2;
            }
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            clear((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  local_170);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                       *)local_170);
            uVar6 = local_120 + 1;
            uVar9 = (ulong)uVar6;
            uVar8 = CONCAT71((int7)((ulong)local_170 >> 8),(uint)elements <= uVar6);
          } while (uVar6 != elements);
          iVar12 = (internal)0x1;
        }
LAB_001187d2:
        local_188[0] = iVar12;
        local_180.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        std::
        vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
        ::~vector(&local_f0.cells);
        if (local_188[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_190);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)local_170,local_188,(AssertionResult *)"checkQuad(gitter, size)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_178,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ob-algdatii-ss18[P]leistungsnachweis-algo/test/test_head.h"
                     ,99,(char *)local_170._0_8_);
          testing::internal::AssertHelper::operator=(&local_178,(Message *)&local_190);
          testing::internal::AssertHelper::~AssertHelper(&local_178);
          if ((undefined1 *)local_170._0_8_ != local_170 + 0x10) {
            operator_delete((void *)local_170._0_8_);
          }
          if (((CONCAT44(local_190._4_4_,(uint)local_190) != 0) &&
              (bVar4 = testing::internal::IsTrue(true), bVar4)) &&
             ((long *)CONCAT44(local_190._4_4_,(uint)local_190) != (long *)0x0)) {
            (**(code **)(*(long *)CONCAT44(local_190._4_4_,(uint)local_190) + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_180,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        ;
      }
    }
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::~vector(&local_118.cells);
    std::
    vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
    ::~vector(&local_78.gitter.cells);
    p_Var3 = local_78.errorInRow.super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
             super__List_node_base._M_next;
    while (p_Var3 != (_List_node_base *)&local_78.errorInRow) {
      p_Var1 = p_Var3->_M_next;
      operator_delete(p_Var3);
      p_Var3 = p_Var1;
    }
    local_128 = local_128 + 1;
    if (local_128 == 10) {
      return;
    }
  } while( true );
}

Assistant:

static void buildAndAssert_Elements_Multiple(int elements) {
        for (unsigned int run = 0; run < RUNS; run++) {
            buildAndAssert_Elements(elements);
        }
    }